

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_layout.cpp
# Opt level: O1

void apply_w_h_cw_ch_r_c_m_s
               (LayoutNode *node,float width,float height,float cellWidth,float cellHeight,
               int rowCount,int columnCount,float margin,float spacing)

{
  float fVar1;
  
  if ((*(float *)&node->field_0x44 != width) || (NAN(*(float *)&node->field_0x44) || NAN(width))) {
    *(float *)&node->field_0x44 = width;
    rengine::Signal<>::emit(&rengine::LayoutNode::onWidthChanged,(SignalEmitter *)node);
  }
  if ((*(float *)&node->field_0x48 != height) || (NAN(*(float *)&node->field_0x48) || NAN(height)))
  {
    *(float *)&node->field_0x48 = height;
    rengine::Signal<>::emit(&rengine::LayoutNode::onHeightChanged,(SignalEmitter *)node);
  }
  if ((*(float *)&node->field_0x4c != cellWidth) ||
     (NAN(*(float *)&node->field_0x4c) || NAN(cellWidth))) {
    *(float *)&node->field_0x4c = cellWidth;
    rengine::Signal<>::emit(&rengine::LayoutNode::onCellWidthChanged,(SignalEmitter *)node);
  }
  if ((*(float *)&node->field_0x50 != cellHeight) ||
     (NAN(*(float *)&node->field_0x50) || NAN(cellHeight))) {
    *(float *)&node->field_0x50 = cellHeight;
    rengine::Signal<>::emit(&rengine::LayoutNode::onCellHeightChanged,(SignalEmitter *)node);
  }
  if (*(int *)&node->field_0x58 != rowCount) {
    *(int *)&node->field_0x58 = rowCount;
    rengine::Signal<>::emit(&rengine::LayoutNode::onRowCountChanged,(SignalEmitter *)node);
  }
  if (*(int *)&node->field_0x54 != columnCount) {
    *(int *)&node->field_0x54 = columnCount;
    rengine::Signal<>::emit(&rengine::LayoutNode::onColumnCountchanged,(SignalEmitter *)node);
  }
  if ((*(float *)&node->field_0x38 != spacing) || (NAN(*(float *)&node->field_0x38) || NAN(spacing))
     ) {
    *(float *)&node->field_0x38 = spacing;
    rengine::Signal<>::emit(&rengine::LayoutNode::onSpacingChanged,(SignalEmitter *)node);
  }
  fVar1 = *(float *)&(node->super_Node).field_0x34;
  if ((fVar1 != margin) || (NAN(fVar1) || NAN(margin))) {
    *(float *)&(node->super_Node).field_0x34 = margin;
    rengine::Signal<>::emit(&rengine::LayoutNode::onMarginChanged,(SignalEmitter *)node);
  }
  rengine::LayoutEngine::updateLayout
            ((LayoutEngine *)&(node->super_Node).field_0x34,&node->super_Node);
  return;
}

Assistant:

static void apply_w_h_cw_ch_r_c_m_s(LayoutNode *node, float width, float height, float cellWidth, float cellHeight, int rowCount, int columnCount, float margin, float spacing)
{
    node->setWidth(width);
    node->setHeight(height);
    node->setCellWidth(cellWidth);
    node->setCellHeight(cellHeight);
    node->setRowCount(rowCount);
    node->setColumnCount(columnCount);
    node->setSpacing(spacing);
    node->setMargin(margin);

    node->updateLayout();
}